

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMan.c
# Opt level: O1

void Cnf_DataWriteIntoFileGz
               (Cnf_Dat_t *p,char *pFileName,int fReadable,Vec_Int_t *vForAlls,Vec_Int_t *vExists)

{
  uint uVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  gzFile file;
  uint *puVar5;
  long lVar6;
  
  file = gzopen(pFileName,"wb");
  if (file == (gzFile)0x0) {
    puts("Cnf_WriteIntoFile(): Output file cannot be opened.");
    return;
  }
  gzprintf(file,"c Result of efficient AIG-to-CNF conversion using package CNF\n");
  gzprintf(file,"p cnf %d %d\n",(ulong)(uint)p->nVars,(ulong)(uint)p->nClauses);
  if (vForAlls != (Vec_Int_t *)0x0) {
    gzprintf(file,"a ");
    if (0 < vForAlls->nSize) {
      lVar6 = 0;
      do {
        gzprintf(file,"%d ",(ulong)(vForAlls->pArray[lVar6] + (uint)(fReadable == 0)));
        lVar6 = lVar6 + 1;
      } while (lVar6 < vForAlls->nSize);
    }
    gzprintf(file,"0\n");
  }
  if (vExists != (Vec_Int_t *)0x0) {
    gzprintf(file,"e ");
    if (0 < vExists->nSize) {
      lVar6 = 0;
      do {
        gzprintf(file,"%d ",(ulong)(vExists->pArray[lVar6] + (uint)(fReadable == 0)));
        lVar6 = lVar6 + 1;
      } while (lVar6 < vExists->nSize);
    }
    gzprintf(file,"0\n");
  }
  if (0 < p->nClauses) {
    lVar6 = 0;
    do {
      puVar2 = (uint *)p->pClauses[lVar6 + 1];
      for (puVar5 = (uint *)p->pClauses[lVar6]; puVar5 < puVar2; puVar5 = puVar5 + 1) {
        uVar1 = *puVar5;
        uVar4 = (int)uVar1 >> 1;
        if (fReadable == 0) {
          uVar3 = ~uVar4;
          if ((uVar1 & 1) == 0) {
            uVar3 = uVar4 + 1;
          }
        }
        else {
          uVar3 = -uVar4;
          if ((uVar1 & 1) == 0) {
            uVar3 = uVar4;
          }
        }
        gzprintf(file,"%d ",(ulong)uVar3);
      }
      lVar6 = lVar6 + 1;
      gzprintf(file,"0\n");
    } while (lVar6 < p->nClauses);
  }
  gzprintf(file,"\n");
  gzclose(file);
  return;
}

Assistant:

void Cnf_DataWriteIntoFileGz( Cnf_Dat_t * p, char * pFileName, int fReadable, Vec_Int_t * vForAlls, Vec_Int_t * vExists )
{
    gzFile pFile;
    int * pLit, * pStop, i, VarId;
    pFile = gzopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cnf_WriteIntoFile(): Output file cannot be opened.\n" );
        return;
    }
    gzprintf( pFile, "c Result of efficient AIG-to-CNF conversion using package CNF\n" );
    gzprintf( pFile, "p cnf %d %d\n", p->nVars, p->nClauses );
    if ( vForAlls )
    {
        gzprintf( pFile, "a " );
        Vec_IntForEachEntry( vForAlls, VarId, i )
            gzprintf( pFile, "%d ", fReadable? VarId : VarId+1 );
        gzprintf( pFile, "0\n" );
    }
    if ( vExists )
    {
        gzprintf( pFile, "e " );
        Vec_IntForEachEntry( vExists, VarId, i )
            gzprintf( pFile, "%d ", fReadable? VarId : VarId+1 );
        gzprintf( pFile, "0\n" );
    }
    for ( i = 0; i < p->nClauses; i++ )
    {
        for ( pLit = p->pClauses[i], pStop = p->pClauses[i+1]; pLit < pStop; pLit++ )
            gzprintf( pFile, "%d ", fReadable? Cnf_Lit2Var2(*pLit) : Cnf_Lit2Var(*pLit) );
        gzprintf( pFile, "0\n" );
    }
    gzprintf( pFile, "\n" );
    gzclose( pFile );
}